

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorydata.cpp
# Opt level: O3

int __thiscall ncnn::MemoryData::load_param(MemoryData *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->w = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->h = iVar1;
  iVar1 = ParamDict::get(pd,0xb,0);
  this->d = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->c = iVar1;
  iVar1 = ParamDict::get(pd,0x15,1);
  this->load_type = iVar1;
  return 0;
}

Assistant:

int MemoryData::load_param(const ParamDict& pd)
{
    w = pd.get(0, 0);
    h = pd.get(1, 0);
    d = pd.get(11, 0);
    c = pd.get(2, 0);
    load_type = pd.get(21, 1);

    return 0;
}